

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildSimd_2Int2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,IRType simdType,IRType valType
          )

{
  ValueType valueType;
  ValueType VVar1;
  OpCode opcode;
  RegOpnd *pRVar2;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *this_00;
  Instr *pIVar3;
  
  valueType = GetSimdValueTypeFromIRType(this,simdType);
  pRVar2 = BuildSrcOpnd(this,src1RegSlot,simdType);
  IR::Opnd::SetValueType(&pRVar2->super_Opnd,valueType);
  src1 = BuildSrcOpnd(this,src2RegSlot,TyInt32);
  VVar1 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&src1->super_Opnd,VVar1);
  src1_00 = BuildSrcOpnd(this,src3RegSlot,valType);
  VVar1 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&src1_00->super_Opnd,VVar1);
  this_00 = BuildDstOpnd(this,dstRegSlot,simdType);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  pIVar3 = AddExtendedArg(this,pRVar2,(RegOpnd *)0x0,offset);
  pRVar2 = IR::Opnd::AsRegOpnd(pIVar3->m_dst);
  pIVar3 = AddExtendedArg(this,src1,pRVar2,offset);
  pRVar2 = IR::Opnd::AsRegOpnd(pIVar3->m_dst);
  pIVar3 = AddExtendedArg(this,src1_00,pRVar2,offset);
  opcode = GetSimdOpcode(this,newOpcode);
  pIVar3 = IR::Instr::New(opcode,&this_00->super_Opnd,pIVar3->m_dst,this->m_func);
  AddInstr(this,pIVar3,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildSimd_2Int2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot, Js::RegSlot src2RegSlot, Js::RegSlot src3RegSlot, IRType simdType, IRType valType)
{
    ValueType valueType = GetSimdValueTypeFromIRType(simdType);

    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, simdType);
    src1Opnd->SetValueType(valueType);

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TyInt32);
    src2Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * src3Opnd = BuildSrcOpnd(src3RegSlot, valType);
    src3Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, simdType);
    dstOpnd->SetValueType(valueType);

    // Given bytecode: dst = op s1, s2, s3
    // Generate:
    // t1 = ExtendedArg_A s1
    // t2 = ExtendedArg_A s2, t1
    // t3 = ExtendedArg_A s3, t2
    // dst = op t3

    IR::Instr* instr = nullptr;

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src3Opnd, instr->GetDst()->AsRegOpnd(), offset);

    Js::OpCode opcode = GetSimdOpcode(newOpcode);
    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}